

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O3

int cuddZddSiftingBackward(DdManager *table,Move *moves,int size)

{
  int iVar1;
  int iVar2;
  Move *pMVar3;
  int iVar4;
  
  iVar2 = 1;
  if (moves != (Move *)0x0) {
    iVar1 = 0;
    iVar4 = -1;
    pMVar3 = moves;
    do {
      if (pMVar3->size < size) {
        size = pMVar3->size;
        iVar4 = iVar1;
      }
      pMVar3 = pMVar3->next;
      iVar1 = iVar1 + 1;
    } while (pMVar3 != (Move *)0x0);
    if ((moves != (Move *)0x0) && (iVar1 = iVar4, iVar4 != 0)) {
      while( true ) {
        iVar1 = iVar1 + -1;
        iVar2 = cuddZddSwapInPlace(table,moves->x,moves->y);
        if (iVar2 == 0) break;
        if ((iVar4 == -1) && (iVar2 == size)) {
          return 1;
        }
        moves = moves->next;
        if (moves == (Move *)0x0) {
          return 1;
        }
        if (iVar1 == 0) {
          return 1;
        }
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
cuddZddSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    int         i;
    int         i_best;
    Move        *move;
    int         res;

    /* Find the minimum size among moves. */
    i_best = -1;
    for (move = moves, i = 0; move != NULL; move = move->next, i++) {
        if (move->size < size) {
            i_best = i;
            size = move->size;
        }
    }

    for (move = moves, i = 0; move != NULL; move = move->next, i++) {
        if (i == i_best)
            break;
        res = cuddZddSwapInPlace(table, move->x, move->y);
        if (!res)
            return(0);
        if (i_best == -1 && res == size)
            break;
    }

    return(1);

}